

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  pointer pVVar1;
  HalfedgeElement *in_RSI;
  Mesh *in_RDI;
  Vector3D *c;
  double theta;
  Vector3D *t;
  Vector3D *s;
  Vector3D *b;
  Vector3D *a;
  Vector3D *v;
  Vector3D *u;
  Vector3D *e20;
  Vector3D *e12;
  Vector3D *e01;
  Vector3D *p2;
  Vector3D *p1;
  Vector3D *p0;
  Halfedge *in_stack_fffffffffffffc58;
  Vector3D *in_stack_fffffffffffffc60;
  Vector3D *this_00;
  Vector3D *in_stack_fffffffffffffc68;
  Vector3D *this_01;
  DrawStyle *in_stack_fffffffffffffc70;
  undefined1 local_308 [40];
  undefined1 *local_2e0;
  double local_2d8;
  _List_node_base *local_2d0;
  Face *in_stack_fffffffffffffd38;
  undefined1 local_2a8 [32];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_258 [32];
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_208 [32];
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1b8 [32];
  undefined1 *local_198;
  undefined8 local_190;
  undefined1 local_168 [32];
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_118 [40];
  undefined1 *local_f0;
  undefined1 local_e8 [40];
  undefined1 *local_c0;
  undefined1 local_b8 [40];
  undefined1 *local_90;
  undefined1 local_88 [40];
  undefined1 *local_60;
  _List_node_base *local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  Vector3D *local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  Vector3D *local_28;
  _List_node_base *local_20;
  Vector3D *local_18;
  HalfedgeElement *local_10;
  
  local_10 = in_RSI;
  get_draw_style(in_RDI,in_RSI);
  DrawStyle::style_halfedge(in_stack_fffffffffffffc70);
  local_20 = (_List_node_base *)Halfedge::vertex(in_stack_fffffffffffffc58);
  pVVar1 = std::_List_const_iterator<CGL::Vertex>::operator->
                     ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffc60);
  local_18 = &pVVar1->position;
  local_38 = (_List_node_base *)Halfedge::next(in_stack_fffffffffffffc58);
  std::_List_const_iterator<CGL::Halfedge>::operator->
            ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffc60);
  local_30 = (_List_node_base *)Halfedge::vertex(in_stack_fffffffffffffc58);
  pVVar1 = std::_List_const_iterator<CGL::Vertex>::operator->
                     ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffc60);
  local_28 = &pVVar1->position;
  local_58 = (_List_node_base *)Halfedge::next(in_stack_fffffffffffffc58);
  std::_List_const_iterator<CGL::Halfedge>::operator->
            ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffc60);
  local_50 = (_List_node_base *)Halfedge::next(in_stack_fffffffffffffc58);
  std::_List_const_iterator<CGL::Halfedge>::operator->
            ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffc60);
  local_48 = (_List_node_base *)Halfedge::vertex(in_stack_fffffffffffffc58);
  pVVar1 = std::_List_const_iterator<CGL::Vertex>::operator->
                     ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffc60);
  local_40 = &pVVar1->position;
  Vector3D::operator-(in_stack_fffffffffffffc60,(Vector3D *)in_stack_fffffffffffffc58);
  local_60 = local_88;
  Vector3D::operator-(in_stack_fffffffffffffc60,(Vector3D *)in_stack_fffffffffffffc58);
  local_90 = local_b8;
  Vector3D::operator-(in_stack_fffffffffffffc60,(Vector3D *)in_stack_fffffffffffffc58);
  local_c0 = local_e8;
  Vector3D::operator-(in_stack_fffffffffffffc60,(Vector3D *)in_stack_fffffffffffffc58);
  local_140 = 0x4000000000000000;
  Vector3D::operator/(in_stack_fffffffffffffc68,(double *)in_stack_fffffffffffffc60);
  local_f0 = local_118;
  Vector3D::operator-(in_stack_fffffffffffffc60,(Vector3D *)in_stack_fffffffffffffc58);
  local_190 = 0x4000000000000000;
  Vector3D::operator/(in_stack_fffffffffffffc68,(double *)in_stack_fffffffffffffc60);
  local_148 = local_168;
  local_1e0 = 0x4014000000000000;
  this_00 = local_18;
  Vector3D::operator/(in_stack_fffffffffffffc68,(double *)local_18);
  Vector3D::operator+(this_00,(Vector3D *)in_stack_fffffffffffffc58);
  local_198 = local_1b8;
  local_230 = 0x4014000000000000;
  this_01 = local_28;
  Vector3D::operator/(local_28,(double *)this_00);
  Vector3D::operator+(this_00,(Vector3D *)in_stack_fffffffffffffc58);
  local_1e8 = local_208;
  Vector3D::operator-(this_00,(Vector3D *)in_stack_fffffffffffffc58);
  local_280 = 0x4014000000000000;
  Vector3D::operator/(this_01,(double *)this_00);
  local_238 = local_258;
  local_2d0 = (_List_node_base *)Halfedge::face(in_stack_fffffffffffffc58);
  std::_List_const_iterator<CGL::Face>::operator->((_List_const_iterator<CGL::Face> *)0x12359e);
  Face::normal(in_stack_fffffffffffffd38);
  cross(this_01,this_00);
  local_288 = local_2a8;
  local_2d8 = 2.6179938779914944;
  cos(2.6179938779914944);
  CGL::operator*((double *)this_01,this_00);
  Vector3D::operator+(this_00,(Vector3D *)in_stack_fffffffffffffc58);
  sin(local_2d8);
  CGL::operator*((double *)this_01,this_00);
  Vector3D::operator+(this_00,(Vector3D *)in_stack_fffffffffffffc58);
  local_2e0 = local_308;
  glBegin(3);
  glVertex3dv(local_198);
  glVertex3dv(local_1e8);
  glVertex3dv(local_2e0);
  glEnd();
  get_draw_style(in_RDI,local_10);
  DrawStyle::style_reset((DrawStyle *)0x1236e0);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}